

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naiveproxy.cpp
# Opt level: O1

int __thiscall naiveproxy::init_proxys(naiveproxy *this)

{
  size_t *psVar1;
  __pid_t _Var2;
  FILE *__stream;
  char *pcVar3;
  byte *pbVar4;
  naiveconfig *this_00;
  _List_node_base *p_Var5;
  tcpproxy *this_01;
  naiveproxy *pnVar6;
  httpproxy *this_02;
  byte *str_00;
  byte local_438 [8];
  char str [1024];
  
  signal(0x11,(__sighandler_t)0x1);
  __stream = fopen("/etc/naiveproxy.conf","r");
  if (__stream == (FILE *)0x0) {
    printf(anon_var_dwarf_1105b,"/etc/naiveproxy.conf");
LAB_00105bc8:
    exit(0);
  }
  pcVar3 = fgets((char *)local_438,0x400,__stream);
  if (pcVar3 != (char *)0x0) {
    str_00 = local_438;
    do {
      while ((pbVar4 = str_00, (ulong)*str_00 < 0x21 &&
             ((0x100000600U >> ((ulong)*str_00 & 0x3f) & 1) != 0))) {
        str_00 = str_00 + 1;
      }
      for (; (*pbVar4 != 0 && (*pbVar4 != 0x23)); pbVar4 = pbVar4 + 1) {
      }
      *pbVar4 = 0;
      if (*str_00 != 0) {
        this_00 = (naiveconfig *)operator_new(0x38);
        naiveconfig::naiveconfig(this_00,(char *)str_00);
        p_Var5 = (_List_node_base *)operator_new(0x18);
        p_Var5[1]._M_next = (_List_node_base *)this_00;
        std::__detail::_List_node_base::_M_hook(p_Var5);
        psVar1 = &(this->cfgs).super__List_base<naiveconfig_*,_std::allocator<naiveconfig_*>_>.
                  _M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
      }
      str_00 = local_438;
      pcVar3 = fgets((char *)str_00,0x400,__stream);
    } while (pcVar3 != (char *)0x0);
  }
  p_Var5 = (this->cfgs).super__List_base<naiveconfig_*,_std::allocator<naiveconfig_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  do {
    if (p_Var5 == (_List_node_base *)&this->cfgs) {
      return 0;
    }
    if (this->daemonized == true) {
      _Var2 = fork();
      if (_Var2 == 0) {
        pnVar6 = GetInstance();
        std::__cxx11::list<naiveconfig_*,_std::allocator<naiveconfig_*>_>::clear(&pnVar6->cfgs);
        if (*(char *)((long)&p_Var5[1]._M_next[1]._M_next + 4) == '\0') {
          this_02 = (httpproxy *)operator_new(0x58);
          tcpproxy::tcpproxy((tcpproxy *)this_02,(naiveconfig *)p_Var5[1]._M_next);
        }
        else {
          this_02 = (httpproxy *)operator_new(0x90);
          httpproxy::httpproxy(this_02,(naiveconfig *)p_Var5[1]._M_next);
        }
        (*(this_02->super_tcpproxy).super_proxy._vptr_proxy[2])();
        goto LAB_00105bc8;
      }
      if (_Var2 < 0) goto LAB_00105bc8;
    }
    else {
      if (*(char *)((long)&p_Var5[1]._M_next[1]._M_next + 4) == '\0') {
        this_01 = (tcpproxy *)operator_new(0x58);
        tcpproxy::tcpproxy(this_01,(naiveconfig *)p_Var5[1]._M_next);
      }
      else {
        this_01 = (tcpproxy *)operator_new(0x90);
        tcpproxy::tcpproxy(this_01,(naiveconfig *)p_Var5[1]._M_next);
        (this_01->super_proxy)._vptr_proxy = (_func_int **)&PTR__httpproxy_00109ca8;
        this_01[1].super_proxy._vptr_proxy = (_func_int **)&this_01[1].sfh._M_h._M_before_begin;
        this_01[1].super_proxy.cfg = (naiveconfig *)0x1;
        *(undefined8 *)&this_01[1].epollfd = 0;
        this_01[1].events = (epoll_event *)0x0;
        *(undefined4 *)&this_01[1].sfh._M_h._M_buckets = 0x3f800000;
        this_01[1].sfh._M_h._M_bucket_count = 0;
        this_01[1].sfh._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      }
      (*(this_01->super_proxy)._vptr_proxy[2])();
    }
    p_Var5 = p_Var5->_M_next;
  } while( true );
}

Assistant:

int naiveproxy::init_proxys()
{

    //忽略SIGCHID
    signal(SIGCHLD, SIG_IGN);

    FILE *fp;
    fp = fopen(CONFIG_FILE_NAME, "r");
    if (fp == NULL)
    {
        printf("打开文件%s失败\n", CONFIG_FILE_NAME);
        exit(0);
    }

    char str[1024];

    while (fgets(str, sizeof(str), fp) != NULL)
    {
        char *p_str = str;
        //删除前导空格等
        while (*p_str == ' ' || *p_str == '\t' || *p_str == '\n')
            p_str++;
        //删除注释
        char *p = p_str;
        while (*p && *p != '#')
            p++;
        *p = 0;
        if (*p_str == 0)
            continue;

        naiveconfig *cfg = new naiveconfig(p_str);
        //由于是push_front，所以配置文件可以看做是从下往上处理的
        cfgs.push_front(cfg);
    }

    for (auto it = cfgs.begin(); it != cfgs.end(); it++)
    {
        if (daemonized)
        {
            pid_t pid;
            pid = fork();
            if (pid == 0)
            {
                //naiveproxy::DestroyInstance();
                naiveproxy::GetInstance()->cfgs.clear();
                //释放父进程打开的文件描述符和申请的cfgs空间。
                // for (int i = 3; i < NOFILE; i++)
                //     close(i);

                proxy *pro = NULL;
                if ((*it)->protocol == PROTOCOL_TCP)
                {
                    pro = new tcpproxy(*it);
                }
                else if ((*it)->protocol == PROTOCOL_UDP)
                {
                }
                else if ((*it)->protocol == PROTOCOL_HTTP)
                {
                    pro = new httpproxy(*it);
                }
                pro->startproxy();
                exit(0);
            }
            else if (pid < 0)
            {
                exit(0);
            }
        }
        else
        {

            proxy *pro = NULL;
            if ((*it)->protocol == PROTOCOL_TCP)
            {
                pro = new tcpproxy(*it);
            }
            else if ((*it)->protocol == PROTOCOL_UDP)
            {
            }
            else if ((*it)->protocol == PROTOCOL_HTTP)
            {
                pro = new httpproxy(*it);
            }
            pro->startproxy();
        }
    }
    return 0;
}